

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.c
# Opt level: O3

int_t cLUMemInit(fact_t fact,void *work,int_t lwork,int m,int n,int_t annz,int panel_size,
                float fill_ratio,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,int **iwork,
                singlecomplex **dwork)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ExpHeader *pEVar6;
  void *pvVar7;
  void *pvVar8;
  int_t *addr;
  int_t *addr_00;
  int iVar9;
  int_t iVar10;
  uint uVar11;
  int n_00;
  ulong uVar12;
  int *piVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int_t nzlumax;
  int_t nzlmax;
  int local_184;
  int local_180;
  int local_17c;
  int_t *local_178;
  ulong local_170;
  LU_space_t *local_168;
  int_t local_15c;
  int_t *local_158;
  int_t *local_150;
  int *local_148;
  int *local_140;
  int local_138 [66];
  
  local_168 = (LU_space_t *)CONCAT44(local_168._4_4_,fill_ratio);
  uVar12 = (ulong)(uint)n;
  Glu->n = n;
  Glu->num_expansions = 0;
  local_17c = m;
  local_15c = annz;
  pEVar6 = (ExpHeader *)superlu_malloc(0x60);
  Glu->expanders = pEVar6;
  if (pEVar6 == (ExpHeader *)0x0) {
    sprintf((char *)local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for expanders",0xd4
            ,"/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cmemory.c");
    superlu_abort_and_exit((char *)local_138);
  }
  local_170 = uVar12;
  if (fact == SamePattern_SameRowPerm) {
    pvVar7 = L->Store;
    pvVar8 = U->Store;
    piVar13 = *(int **)((long)pvVar7 + 0x30);
    local_148 = *(int **)((long)pvVar7 + 0x28);
    local_158 = *(int_t **)((long)pvVar7 + 0x10);
    local_150 = *(int_t **)((long)pvVar7 + 0x20);
    local_178 = *(int_t **)((long)pvVar8 + 0x18);
    local_138[0] = Glu->nzlmax;
    local_180 = Glu->nzumax;
    local_184 = Glu->nzlumax;
    if (lwork == 0) {
      Glu->MemModel = SYSTEM;
    }
    else {
      if (lwork == -1) {
        return n * 0x15 + (local_138[0] + (panel_size * 2 + 7) * local_17c) * 4 + local_180 * 0xc +
               (panel_size + 1) * local_17c * 8 + local_184 * 8 + 0x14;
      }
      uVar11 = lwork + 3;
      if (-1 < lwork) {
        uVar11 = lwork;
      }
      Glu->MemModel = USER;
      (Glu->stack).top2 = uVar11 & 0xfffffffc;
      (Glu->stack).size = uVar11 & 0xfffffffc;
    }
    addr = *(int_t **)((long)pvVar7 + 0x18);
    pEVar6 = Glu->expanders;
    pEVar6[2].mem = addr;
    pvVar7 = *(void **)((long)pvVar7 + 8);
    pEVar6->mem = pvVar7;
    addr_00 = *(int_t **)((long)pvVar8 + 0x10);
    pEVar6[3].mem = addr_00;
    pvVar8 = *(void **)((long)pvVar8 + 8);
    pEVar6[1].mem = pvVar8;
    pEVar6[2].size = local_138[0];
    pEVar6->size = local_184;
    pEVar6[3].size = local_180;
    pEVar6[1].size = local_180;
    goto LAB_00107212;
  }
  local_184 = (int)((float)local_15c * local_168._0_4_);
  local_180 = local_184;
  local_138[0] = local_184;
  if (lwork == 0) {
    Glu->MemModel = SYSTEM;
LAB_00106e53:
    local_168 = &Glu->MemModel;
    iVar4 = n + 1;
    piVar13 = int32Malloc(iVar4);
    local_148 = int32Malloc(iVar4);
    local_150 = intMalloc(iVar4);
    local_158 = intMalloc(iVar4);
    local_178 = intMalloc(iVar4);
  }
  else {
    if (lwork == -1) {
      return (panel_size * 0x10 + 0x24) * local_17c + n * 0x15 + local_184 * 0x18 + 0x14;
    }
    local_168 = &Glu->MemModel;
    if (lwork < 1) {
      if (Glu->MemModel == SYSTEM) goto LAB_00106e53;
    }
    else {
      Glu->MemModel = USER;
      (Glu->stack).used = 0;
      (Glu->stack).top1 = 0;
      (Glu->stack).top2 = lwork & 0x7ffffffcU;
      (Glu->stack).size = lwork & 0x7ffffffcU;
      (Glu->stack).array = work;
    }
    iVar9 = n * 4 + 4;
    iVar3 = (Glu->stack).used + iVar9;
    iVar4 = (Glu->stack).size;
    if (iVar3 < iVar4) {
      iVar5 = (Glu->stack).top1;
      piVar13 = (int *)((long)iVar5 + (long)(Glu->stack).array);
      (Glu->stack).top1 = iVar5 + iVar9;
      (Glu->stack).used = iVar3;
      iVar3 = iVar3 + iVar9;
    }
    else {
      piVar13 = (int *)0x0;
    }
    if (iVar3 < iVar4) {
      iVar5 = (Glu->stack).top1;
      local_148 = (int *)((long)iVar5 + (long)(Glu->stack).array);
      (Glu->stack).top1 = iVar5 + iVar9;
      (Glu->stack).used = iVar3;
      iVar3 = iVar3 + iVar9;
    }
    else {
      local_148 = (int *)0x0;
    }
    if (iVar3 < iVar4) {
      iVar5 = (Glu->stack).top1;
      local_150 = (int_t *)((long)iVar5 + (long)(Glu->stack).array);
      (Glu->stack).top1 = iVar5 + iVar9;
      (Glu->stack).used = iVar3;
      iVar3 = iVar3 + iVar9;
    }
    else {
      local_150 = (int_t *)0x0;
    }
    if (iVar3 < iVar4) {
      iVar5 = (Glu->stack).top1;
      local_158 = (int_t *)((long)iVar5 + (long)(Glu->stack).array);
      (Glu->stack).top1 = iVar5 + iVar9;
      (Glu->stack).used = iVar3;
      iVar3 = iVar3 + iVar9;
    }
    else {
      local_158 = (int_t *)0x0;
    }
    if (iVar3 < iVar4) {
      iVar4 = (Glu->stack).top1;
      local_178 = (int_t *)((long)iVar4 + (long)(Glu->stack).array);
      (Glu->stack).top1 = iVar9 + iVar4;
      (Glu->stack).used = iVar3;
    }
    else {
      local_178 = (int_t *)0x0;
    }
  }
  pvVar7 = cexpand(&local_184,LUSUP,0,0,Glu);
  pvVar8 = cexpand(&local_180,UCOL,0,0,Glu);
  addr = (int_t *)cexpand(local_138,LSUB,0,0,Glu);
  addr_00 = (int_t *)cexpand(&local_180,USUB,0,1,Glu);
  auVar14._0_4_ = -(uint)((int)((ulong)pvVar7 >> 0x20) == 0 && (int)pvVar7 == 0);
  auVar14._4_4_ = -(uint)((int)pvVar8 == 0 && (int)((ulong)pvVar8 >> 0x20) == 0);
  auVar14._8_4_ = -(uint)((int)((ulong)addr >> 0x20) == 0 && (int)addr == 0);
  auVar14._12_4_ = -(uint)((int)addr_00 == 0 && (int)((ulong)addr_00 >> 0x20) == 0);
  iVar4 = movmskps((int)addr_00,auVar14);
  if (iVar4 != 0) {
    local_140 = piVar13;
    do {
      if (*local_168 == SYSTEM) {
        superlu_free(pvVar7);
        superlu_free(pvVar8);
        superlu_free(addr);
        superlu_free(addr_00);
      }
      else {
        iVar4 = local_180 * 0xc + local_184 * 8 + local_138[0] * 4;
        uVar1 = (Glu->stack).used;
        uVar2 = (Glu->stack).top1;
        (Glu->stack).used = uVar1 - iVar4;
        (Glu->stack).top1 = uVar2 - iVar4;
      }
      iVar4 = local_184 / 2;
      iVar9 = local_180 / 2;
      iVar3 = local_138[0] / 2;
      local_184 = iVar4;
      local_180 = iVar9;
      local_138[0] = iVar3;
      if (iVar4 < local_15c) {
        puts("Not enough memory to perform factorization.");
        return (int)local_170 * 0x29 + iVar4 * 8 + iVar9 * 0xc + iVar3 * 4;
      }
      pvVar7 = cexpand(&local_184,LUSUP,0,0,Glu);
      pvVar8 = cexpand(&local_180,UCOL,0,0,Glu);
      addr = (int_t *)cexpand(local_138,LSUB,0,0,Glu);
      addr_00 = (int_t *)cexpand(&local_180,USUB,0,1,Glu);
      auVar15._0_4_ = -(uint)((int)((ulong)pvVar7 >> 0x20) == 0 && (int)pvVar7 == 0);
      auVar15._4_4_ = -(uint)((int)pvVar8 == 0 && (int)((ulong)pvVar8 >> 0x20) == 0);
      auVar15._8_4_ = -(uint)((int)((ulong)addr >> 0x20) == 0 && (int)addr == 0);
      auVar15._12_4_ = -(uint)((int)addr_00 == 0 && (int)((ulong)addr_00 >> 0x20) == 0);
      iVar4 = movmskps((int)addr_00,auVar15);
      piVar13 = local_140;
    } while (iVar4 != 0);
  }
LAB_00107212:
  iVar9 = local_138[0];
  iVar3 = local_180;
  iVar4 = local_184;
  Glu->xsup = piVar13;
  Glu->supno = local_148;
  Glu->lsub = addr;
  Glu->xlsub = local_150;
  Glu->lusup = pvVar7;
  Glu->xlusup = local_158;
  Glu->ucol = pvVar8;
  Glu->usub = addr_00;
  Glu->xusub = local_178;
  Glu->nzlmax = local_138[0];
  Glu->nzumax = local_180;
  Glu->nzlumax = local_184;
  n_00 = (int)local_170;
  iVar5 = cLUWorkInit(local_17c,n_00,panel_size,iwork,dwork,Glu);
  if (iVar5 == 0) {
    Glu->num_expansions = Glu->num_expansions + 1;
    iVar10 = 0;
  }
  else {
    iVar10 = n_00 * 0x29 + iVar9 * 4 + iVar3 * 0xc + iVar4 * 8 + iVar5;
  }
  return iVar10;
}

Assistant:

int_t
cLUMemInit(fact_t fact, void *work, int_t lwork, int m, int n, int_t annz,
	  int panel_size, float fill_ratio, SuperMatrix *L, SuperMatrix *U,
          GlobalLU_t *Glu, int **iwork, singlecomplex **dwork)
{
    int      info, iword, dword;
    SCformat *Lstore;
    NCformat *Ustore;
    int      *xsup, *supno;
    int_t    *lsub, *xlsub;
    singlecomplex   *lusup;
    int_t    *xlusup;
    singlecomplex   *ucol;
    int_t    *usub, *xusub;
    int_t    nzlmax, nzumax, nzlumax;
    
    iword     = sizeof(int);
    dword     = sizeof(singlecomplex);
    Glu->n    = n;
    Glu->num_expansions = 0;

    Glu->expanders = (ExpHeader *) SUPERLU_MALLOC( NO_MEMTYPE *
                                                     sizeof(ExpHeader) );
    if ( !Glu->expanders ) ABORT("SUPERLU_MALLOC fails for expanders");
    
    if ( fact != SamePattern_SameRowPerm ) {
	/* Guess for L\U factors */
	nzumax = nzlumax = nzlmax = fill_ratio * annz;
	//nzlmax = SUPERLU_MAX(1, fill_ratio/4.) * annz;

	if ( lwork == -1 ) {
	    return ( GluIntArray(n) * iword + TempSpace(m, panel_size)
		    + (nzlmax+nzumax)*iword + (nzlumax+nzumax)*dword + n );
        } else {
	    cSetupSpace(work, lwork, Glu);
	}
	
#if ( PRNTlevel >= 1 )
	printf("cLUMemInit() called: fill_ratio %.0f, nzlmax %lld, nzumax %lld\n", 
	       fill_ratio, (long long) nzlmax, (long long) nzumax);
	fflush(stdout);
#endif	
	
	/* Integer pointers for L\U factors */
	if ( Glu->MemModel == SYSTEM ) {
	    xsup   = int32Malloc(n+1);
	    supno  = int32Malloc(n+1);
	    xlsub  = intMalloc(n+1);
	    xlusup = intMalloc(n+1);
	    xusub  = intMalloc(n+1);
	} else {
	    xsup   = (int *)cuser_malloc((n+1) * iword, HEAD, Glu);
	    supno  = (int *)cuser_malloc((n+1) * iword, HEAD, Glu);
	    xlsub  = cuser_malloc((n+1) * iword, HEAD, Glu);
	    xlusup = cuser_malloc((n+1) * iword, HEAD, Glu);
	    xusub  = cuser_malloc((n+1) * iword, HEAD, Glu);
	}

	lusup = (singlecomplex *) cexpand( &nzlumax, LUSUP, 0, 0, Glu );
	ucol  = (singlecomplex *) cexpand( &nzumax, UCOL, 0, 0, Glu );
	lsub  = (int_t *) cexpand( &nzlmax, LSUB, 0, 0, Glu );
	usub  = (int_t *) cexpand( &nzumax, USUB, 0, 1, Glu );

	while ( !lusup || !ucol || !lsub || !usub ) {
	    if ( Glu->MemModel == SYSTEM ) {
		SUPERLU_FREE(lusup); 
		SUPERLU_FREE(ucol); 
		SUPERLU_FREE(lsub); 
		SUPERLU_FREE(usub);
	    } else {
		cuser_free((nzlumax+nzumax)*dword+(nzlmax+nzumax)*iword,
                            HEAD, Glu);
	    }
	    nzlumax /= 2;
	    nzumax /= 2;
	    nzlmax /= 2;
	    if ( nzlumax < annz ) {
		printf("Not enough memory to perform factorization.\n");
		return (cmemory_usage(nzlmax, nzumax, nzlumax, n) + n);
	    }
#if ( PRNTlevel >= 1)
	    printf("cLUMemInit() reduce size: nzlmax %ld, nzumax %ld\n", 
		   (long) nzlmax, (long) nzumax);
	    fflush(stdout);
#endif
	    lusup = (singlecomplex *) cexpand( &nzlumax, LUSUP, 0, 0, Glu );
	    ucol  = (singlecomplex *) cexpand( &nzumax, UCOL, 0, 0, Glu );
	    lsub  = (int_t *) cexpand( &nzlmax, LSUB, 0, 0, Glu );
	    usub  = (int_t *) cexpand( &nzumax, USUB, 0, 1, Glu );
	}
	
    } else {
	/* fact == SamePattern_SameRowPerm */
	Lstore   = L->Store;
	Ustore   = U->Store;
	xsup     = Lstore->sup_to_col;
	supno    = Lstore->col_to_sup;
	xlsub    = Lstore->rowind_colptr;
	xlusup   = Lstore->nzval_colptr;
	xusub    = Ustore->colptr;
	nzlmax   = Glu->nzlmax;    /* max from previous factorization */
	nzumax   = Glu->nzumax;
	nzlumax  = Glu->nzlumax;
	
	if ( lwork == -1 ) {
	    return ( GluIntArray(n) * iword + TempSpace(m, panel_size)
		    + (nzlmax+nzumax)*iword + (nzlumax+nzumax)*dword + n );
        } else if ( lwork == 0 ) {
	    Glu->MemModel = SYSTEM;
	} else {
	    Glu->MemModel = USER;
	    Glu->stack.top2 = (lwork/4)*4; /* must be word-addressable */
	    Glu->stack.size = Glu->stack.top2;
	}
	
	lsub  = Glu->expanders[LSUB].mem  = Lstore->rowind;
	lusup = Glu->expanders[LUSUP].mem = Lstore->nzval;
	usub  = Glu->expanders[USUB].mem  = Ustore->rowind;
	ucol  = Glu->expanders[UCOL].mem  = Ustore->nzval;;
	Glu->expanders[LSUB].size         = nzlmax;
	Glu->expanders[LUSUP].size        = nzlumax;
	Glu->expanders[USUB].size         = nzumax;
	Glu->expanders[UCOL].size         = nzumax;	
    }

    Glu->xsup    = xsup;
    Glu->supno   = supno;
    Glu->lsub    = lsub;
    Glu->xlsub   = xlsub;
    Glu->lusup   = (void *) lusup;
    Glu->xlusup  = xlusup;
    Glu->ucol    = (void *) ucol;
    Glu->usub    = usub;
    Glu->xusub   = xusub;
    Glu->nzlmax  = nzlmax;
    Glu->nzumax  = nzumax;
    Glu->nzlumax = nzlumax;
    
    info = cLUWorkInit(m, n, panel_size, iwork, dwork, Glu);
    if ( info )
	return ( info + cmemory_usage(nzlmax, nzumax, nzlumax, n) + n);
    
    ++Glu->num_expansions;
    return 0;
    
}